

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LIRMIA3.cpp
# Opt level: O1

void * LIRMIA3Thread(void *pParam)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  size_t sVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  long lVar9;
  uint uVar10;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  long lVar14;
  char *pcVar15;
  long lVar16;
  double dVar17;
  double dVar18;
  int pws [4];
  CHRONO chrono_period;
  char szTemp [256];
  LIRMIA3 lirmia3;
  char szSaveFilePath [256];
  timespec local_888;
  int local_874;
  double local_870;
  timespec local_868;
  long local_858;
  long lStack_850;
  long local_848;
  long lStack_840;
  timespec local_838;
  int local_828;
  double local_820;
  double local_818;
  double local_810;
  char local_808 [256];
  LIRMIA3 local_708;
  char local_138 [264];
  
  memset(&local_708,0,0x5d0);
  iVar3 = clock_getres(4,&local_838);
  if ((iVar3 == 0) && (iVar3 = clock_gettime(4,&local_868), iVar3 == 0)) {
    local_828 = 0;
    local_858 = 0;
    lStack_850 = 0;
    local_848 = 0;
    lStack_840 = 0;
  }
  dVar17 = 2.47032822920623e-322;
  bVar1 = false;
  local_874 = 0;
  do {
    lVar9 = (long)(SUB84(dVar17,0) * 1000);
    local_870 = dVar17;
    while( true ) {
      if (local_828 == 0) {
        clock_gettime(4,&local_888);
        local_858 = local_888.tv_sec;
        lStack_850 = local_888.tv_nsec;
        local_888.tv_sec =
             (local_888.tv_sec + local_848 + (local_888.tv_nsec + lStack_840) / 1000000000) -
             local_868.tv_sec;
        local_888.tv_nsec = (local_888.tv_nsec + lStack_840) % 1000000000 - local_868.tv_nsec;
        if (local_888.tv_nsec < 0) {
          local_888.tv_sec = local_888.tv_sec + local_888.tv_nsec / 1000000000 + -1;
          local_888.tv_nsec = local_888.tv_nsec % 1000000000 + 1000000000;
        }
        local_848 = local_888.tv_sec;
        lStack_840 = local_888.tv_nsec;
      }
      iVar3 = clock_getres(4,&local_838);
      if ((iVar3 == 0) && (iVar3 = clock_gettime(4,&local_868), iVar3 == 0)) {
        local_828 = 0;
        local_848 = 0;
        lStack_840 = 0;
        local_858 = 0;
        lStack_850 = 0;
      }
      local_888.tv_sec = lVar9 / 1000000;
      local_888.tv_nsec = (lVar9 % 1000000) * 1000;
      nanosleep(&local_888,(timespec *)0x0);
      dVar17 = local_870;
      if (bPauseLIRMIA3 == 0) break;
      if (bVar1) {
        puts("LIRMIA3 paused.");
        iVar3 = CloseRS232Port(&local_708.RS232Port);
        pcVar15 = "LIRMIA3 disconnection failed.";
        if (iVar3 == 0) {
          pcVar15 = "LIRMIA3 disconnected.";
        }
        puts(pcVar15);
      }
      if (bExit != 0) {
        bVar2 = true;
        goto LAB_001c64ab;
      }
      local_888.tv_sec = 0;
      local_888.tv_nsec = 100000000;
      bVar1 = false;
      nanosleep(&local_888,(timespec *)0x0);
    }
    if (bRestartLIRMIA3 != 0) {
      if (bVar1) {
        puts("Restarting a LIRMIA3.");
        iVar3 = CloseRS232Port(&local_708.RS232Port);
        pcVar15 = "LIRMIA3 disconnection failed.";
        if (iVar3 == 0) {
          pcVar15 = "LIRMIA3 disconnected.";
        }
        puts(pcVar15);
      }
      bRestartLIRMIA3 = 0;
      bVar1 = false;
    }
    if (bVar1) {
      pthread_mutex_lock((pthread_mutex_t *)&StateVariablesCS);
      local_820 = u1 * 1000.0;
      local_818 = u2 * 1000.0;
      local_810 = u3 * 1000.0;
      local_870 = u4 * 1000.0;
      pthread_mutex_unlock((pthread_mutex_t *)&StateVariablesCS);
      local_888.tv_sec = 0;
      local_888.tv_nsec = 0;
      lVar14 = (long)local_708.rightthrusterchan;
      dVar18 = local_818 * 0.5;
      *(int *)((long)&local_888.tv_sec + lVar14 * 4) = (int)(local_820 * 0.5) + 0x5dc;
      lVar16 = (long)local_708.leftthrusterchan;
      *(int *)((long)&local_888.tv_sec + lVar16 * 4) = (int)dVar18 + 0x5dc;
      lVar9 = (long)local_708.frontthrusterchan;
      dVar18 = local_870 * 0.5;
      *(int *)((long)&local_888.tv_sec + lVar9 * 4) = (int)(local_810 * 0.5) + 0x5dc;
      lVar12 = (long)local_708.rearthrusterchan;
      *(int *)((long)&local_888.tv_sec + lVar12 * 4) = (int)dVar18 + 0x5dc;
      iVar3 = *(int *)((long)&local_888.tv_sec + lVar14 * 4);
      if (1999 < iVar3) {
        iVar3 = 2000;
      }
      if (iVar3 < 0x3e9) {
        iVar3 = 1000;
      }
      *(int *)((long)&local_888.tv_sec + lVar14 * 4) = iVar3;
      iVar3 = *(int *)((long)&local_888.tv_sec + lVar16 * 4);
      if (1999 < iVar3) {
        iVar3 = 2000;
      }
      if (iVar3 < 0x3e9) {
        iVar3 = 1000;
      }
      *(int *)((long)&local_888.tv_sec + lVar16 * 4) = iVar3;
      iVar3 = *(int *)((long)&local_888.tv_sec + lVar9 * 4);
      if (1999 < iVar3) {
        iVar3 = 2000;
      }
      if (iVar3 < 0x3e9) {
        iVar3 = 1000;
      }
      *(int *)((long)&local_888.tv_sec + lVar9 * 4) = iVar3;
      iVar3 = *(int *)((long)&local_888.tv_sec + lVar12 * 4);
      if (1999 < iVar3) {
        iVar3 = 2000;
      }
      if (iVar3 < 0x3e9) {
        iVar3 = 1000;
      }
      *(int *)((long)&local_888.tv_sec + lVar12 * 4) = iVar3;
      iVar3 = SetAllPWMsLIRMIA3(&local_708,(int *)&local_888);
      if (iVar3 == 0) {
        bVar1 = true;
        bVar2 = false;
      }
      else {
        puts("Connection to a LIRMIA3 lost.");
        iVar3 = CloseRS232Port(&local_708.RS232Port);
        if (iVar3 == 0) {
          pcVar15 = "LIRMIA3 disconnected.";
        }
        else {
          pcVar15 = "LIRMIA3 disconnection failed.";
        }
        puts(pcVar15);
LAB_001c629e:
        bVar1 = false;
        bVar2 = true;
      }
    }
    else {
      iVar3 = ConnectLIRMIA3(&local_708,"LIRMIA3.txt");
      if (iVar3 != 0) {
        local_888.tv_sec = 1;
        local_888.tv_nsec = 0;
        nanosleep(&local_888,(timespec *)0x0);
        goto LAB_001c629e;
      }
      dVar17 = (double)(long)local_708.threadperiod;
      local_888.tv_sec = ((long)dVar17 * 1000) / 1000000;
      local_888.tv_nsec = (((long)dVar17 * 1000) % 1000000) * 1000;
      nanosleep(&local_888,(timespec *)0x0);
      if ((FILE *)local_708.pfSaveFile != (FILE *)0x0) {
        fclose((FILE *)local_708.pfSaveFile);
        local_708.pfSaveFile = (FILE *)0x0;
      }
      bVar2 = false;
      bVar1 = true;
      if ((local_708.bSaveRawData != 0) && ((FILE *)local_708.pfSaveFile == (FILE *)0x0)) {
        if (local_708.szCfgFilePath[0] == '\0') {
          builtin_strncpy(local_808,"lirmia3",8);
        }
        else {
          sprintf(local_808,"%.127s",local_708.szCfgFilePath);
        }
        sVar5 = strlen(local_808);
        uVar4 = (uint)sVar5;
        uVar13 = sVar5 & 0xffffffff;
        uVar6 = (int)uVar4 >> 0x1f & uVar4;
        uVar11 = sVar5 & 0xffffffff;
        do {
          uVar13 = uVar13 - 1;
          uVar10 = (uint)uVar11;
          uVar11 = (ulong)(uVar6 - 1);
          uVar7 = uVar6;
          if ((int)uVar10 < 1) break;
          uVar11 = (ulong)(uVar10 - 1);
          uVar7 = uVar10;
        } while (local_808[uVar13 & 0xffffffff] != '.');
        if ((int)uVar7 <= (int)uVar4 && 1 < (int)uVar7) {
          memset(local_808 + uVar11,0,sVar5 - uVar11);
        }
        pthread_mutex_lock((pthread_mutex_t *)&strtimeCS);
        pcVar15 = strtimeex_fns();
        sprintf(local_138,"log/%.127s_%.64s.txt",local_808,pcVar15);
        pthread_mutex_unlock((pthread_mutex_t *)&strtimeCS);
        bVar2 = false;
        local_708.pfSaveFile = (FILE *)fopen(local_138,"wb");
        if ((FILE *)local_708.pfSaveFile == (FILE *)0x0) {
          puts("Unable to create LIRMIA3 data file.");
          bVar2 = false;
          goto LAB_001c64ab;
        }
      }
    }
    if ((bVar2) &&
       (local_874 = local_874 + 1, ExitOnErrorCount <= local_874 && 0 < ExitOnErrorCount)) {
      bExit = 1;
    }
    if (bExit != 0) {
LAB_001c64ab:
      if (!bVar2) {
        local_888.tv_sec = 0;
        local_888.tv_nsec = 0;
        lVar12 = (long)local_708.rightthrusterchan;
        *(undefined4 *)((long)&local_888.tv_sec + lVar12 * 4) = 0x5dc;
        lVar14 = (long)local_708.leftthrusterchan;
        *(undefined4 *)((long)&local_888.tv_sec + lVar14 * 4) = 0x5dc;
        lVar16 = (long)local_708.frontthrusterchan;
        *(undefined4 *)((long)&local_888.tv_sec + lVar16 * 4) = 0x5dc;
        lVar9 = (long)local_708.rearthrusterchan;
        *(undefined4 *)((long)&local_888.tv_sec + lVar9 * 4) = 0x5dc;
        iVar3 = *(int *)((long)&local_888.tv_sec + lVar12 * 4);
        if (1999 < iVar3) {
          iVar3 = 2000;
        }
        if (iVar3 < 0x3e9) {
          iVar3 = 1000;
        }
        *(int *)((long)&local_888.tv_sec + lVar12 * 4) = iVar3;
        iVar3 = *(int *)((long)&local_888.tv_sec + lVar14 * 4);
        if (1999 < iVar3) {
          iVar3 = 2000;
        }
        if (iVar3 < 0x3e9) {
          iVar3 = 1000;
        }
        *(int *)((long)&local_888.tv_sec + lVar14 * 4) = iVar3;
        iVar3 = *(int *)((long)&local_888.tv_sec + lVar16 * 4);
        if (1999 < iVar3) {
          iVar3 = 2000;
        }
        if (iVar3 < 0x3e9) {
          iVar3 = 1000;
        }
        *(int *)((long)&local_888.tv_sec + lVar16 * 4) = iVar3;
        iVar3 = *(int *)((long)&local_888.tv_sec + lVar9 * 4);
        iVar8 = 2000;
        if (iVar3 < 2000) {
          iVar8 = iVar3;
        }
        if (iVar8 < 0x3e9) {
          iVar8 = 1000;
        }
        *(int *)((long)&local_888.tv_sec + lVar9 * 4) = iVar8;
        SetAllPWMsLIRMIA3(&local_708,(int *)&local_888);
        local_888.tv_sec = 0;
        local_888.tv_nsec = 50000000;
        nanosleep(&local_888,(timespec *)0x0);
      }
      if (local_828 == 0) {
        clock_gettime(4,&local_888);
        local_858 = local_888.tv_sec;
        lStack_850 = local_888.tv_nsec;
        local_888.tv_sec =
             (local_888.tv_sec + local_848 + (local_888.tv_nsec + lStack_840) / 1000000000) -
             local_868.tv_sec;
        local_888.tv_nsec = (local_888.tv_nsec + lStack_840) % 1000000000 - local_868.tv_nsec;
        if (local_888.tv_nsec < 0) {
          local_888.tv_sec = local_888.tv_sec + local_888.tv_nsec / 1000000000 + -1;
          local_888.tv_nsec = local_888.tv_nsec % 1000000000 + 1000000000;
        }
        local_848 = local_888.tv_sec;
        lStack_840 = local_888.tv_nsec;
      }
      if ((FILE *)local_708.pfSaveFile != (FILE *)0x0) {
        fclose((FILE *)local_708.pfSaveFile);
        local_708.pfSaveFile = (FILE *)0x0;
      }
      if (!bVar2) {
        iVar3 = CloseRS232Port(&local_708.RS232Port);
        pcVar15 = "LIRMIA3 disconnection failed.";
        if (iVar3 == 0) {
          pcVar15 = "LIRMIA3 disconnected.";
        }
        puts(pcVar15);
      }
      if (bExit == 0) {
        bExit = 1;
      }
      return (void *)0x0;
    }
  } while( true );
}

Assistant:

THREAD_PROC_RETURN_VALUE LIRMIA3Thread(void* pParam)
{
	LIRMIA3 lirmia3;
	double thrust1 = 0, thrust2 = 0, thrust3 = 0, thrust4 = 0;
	BOOL bConnected = FALSE;
	CHRONO chrono_period;
	int threadperiod = 50;
	int errcount = 0;
	int i = 0;
	char szSaveFilePath[256];
	char szTemp[256];

	UNREFERENCED_PARAMETER(pParam);

	memset(&lirmia3, 0, sizeof(LIRMIA3));

	StartChrono(&chrono_period);

	for (;;)
	{
		StopChronoQuick(&chrono_period);
		StartChrono(&chrono_period);

		uSleep(1000*threadperiod);

		if (bPauseLIRMIA3) 
		{
			if (bConnected)
			{
				printf("LIRMIA3 paused.\n");
				bConnected = FALSE;
				DisconnectLIRMIA3(&lirmia3);
			}
			if (bExit) break;
			mSleep(100);
			continue;
		}

		if (bRestartLIRMIA3) 
		{
			if (bConnected)
			{
				printf("Restarting a LIRMIA3.\n");
				bConnected = FALSE;
				DisconnectLIRMIA3(&lirmia3);
			}
			bRestartLIRMIA3 = FALSE;
		}

		if (!bConnected)
		{
			if (ConnectLIRMIA3(&lirmia3, "LIRMIA3.txt") == EXIT_SUCCESS) 
			{
				bConnected = TRUE; 
				threadperiod = lirmia3.threadperiod;
				uSleep(1000*threadperiod);

				if (lirmia3.pfSaveFile != NULL)
				{
					fclose(lirmia3.pfSaveFile); 
					lirmia3.pfSaveFile = NULL;
				}
				if ((lirmia3.bSaveRawData)&&(lirmia3.pfSaveFile == NULL)) 
				{
					if (strlen(lirmia3.szCfgFilePath) > 0)
					{
						sprintf(szTemp, "%.127s", lirmia3.szCfgFilePath);
					}
					else
					{
						sprintf(szTemp, "lirmia3");
					}
					// Remove the extension.
					for (i = (int)strlen(szTemp)-1; i >= 0; i--) { if (szTemp[i] == '.') break; }
					if ((i > 0)&&(i < (int)strlen(szTemp))) memset(szTemp+i, 0, strlen(szTemp)-i);
					//if (strlen(szTemp) > 4) memset(szTemp+strlen(szTemp)-4, 0, 4);
					EnterCriticalSection(&strtimeCS);
					sprintf(szSaveFilePath, LOG_FOLDER"%.127s_%.64s.txt", szTemp, strtimeex_fns());
					LeaveCriticalSection(&strtimeCS);
					lirmia3.pfSaveFile = fopen(szSaveFilePath, "wb");
					if (lirmia3.pfSaveFile == NULL) 
					{
						printf("Unable to create LIRMIA3 data file.\n");
						break;
					}
				}
			}
			else 
			{
				bConnected = FALSE;
				mSleep(1000);
			}
		}
		else
		{
			EnterCriticalSection(&StateVariablesCS);
			thrust1 = u1;
			thrust2 = u2;
			thrust3 = u3;
			thrust4 = u4;
			LeaveCriticalSection(&StateVariablesCS);
			if (SetThrustersLIRMIA3(&lirmia3, thrust1, thrust2, thrust3, thrust4) != EXIT_SUCCESS)
			{
				printf("Connection to a LIRMIA3 lost.\n");
				bConnected = FALSE;
				DisconnectLIRMIA3(&lirmia3);
			}
		}

		//printf("LIRMIA3Thread period : %f s.\n", GetTimeElapsedChronoQuick(&chrono_period));
		if (!bConnected) { errcount++; if ((ExitOnErrorCount > 0)&&(errcount >= ExitOnErrorCount)) bExit = TRUE; }
		if (bExit) break;
	}

	// Ensure the thrusters are stopped...
	if (bConnected)
	{
		SetThrustersLIRMIA3(&lirmia3, 0, 0, 0, 0);
		mSleep(50);
	}

	StopChronoQuick(&chrono_period);

	if (lirmia3.pfSaveFile != NULL)
	{
		fclose(lirmia3.pfSaveFile); 
		lirmia3.pfSaveFile = NULL;
	}

	if (bConnected) DisconnectLIRMIA3(&lirmia3);

	if (!bExit) bExit = TRUE; // Unexpected program exit...

	return 0;
}